

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alcCaptureSamples(ALCdevice *_device,ALCvoid *buffer,ALCsizei samples)

{
  DeviceWrapper *local_30;
  DeviceWrapper *device;
  ALCsizei samples_local;
  ALCvoid *buffer_local;
  ALCdevice *_device_local;
  
  local_30 = (DeviceWrapper *)_device;
  if (_device == (ALCdevice *)0x0) {
    local_30 = &null_device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alcCaptureSamples);
  IO_PTR(_device);
  IO_PTR(buffer);
  IO_ALCSIZEI(samples);
  if ((samples != 0) && (local_30->samplesize != 0)) {
    memset(buffer,0,(long)(samples * local_30->samplesize));
  }
  (*REAL_alcCaptureSamples)(local_30->device,buffer,samples);
  IO_BLOB((uint8 *)buffer,(long)(samples * local_30->samplesize));
  check_alc_error_events(local_30);
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alcCaptureSamples(ALCdevice *_device, ALCvoid *buffer, ALCsizei samples)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    IO_START(alcCaptureSamples);
    IO_PTR(_device);
    IO_PTR(buffer);
    IO_ALCSIZEI(samples);
    if (samples && device->samplesize) {
        memset(buffer, '\0', samples * device->samplesize);
    }
    REAL_alcCaptureSamples(device->device, buffer, samples);
    IO_BLOB(buffer, samples * device->samplesize);
    IO_END_ALC(device);
}